

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  float fVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  long lVar5;
  int iVar6;
  ImVec2 *pIVar7;
  ImVec2 *pIVar8;
  ImVec2 *pIVar9;
  float in_XMM0_Da;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (text == (char *)0x0) {
    text = (char *)ref_pos;
    if (ref_pos != (ImVec2 *)0xffffffffffffffff) {
      do {
        if (*(char *)&((ImVec2 *)text)->x == '#') {
          if (*(char *)((long)&((ImVec2 *)text)->x + 1) == '#') goto LAB_00124c1f;
        }
        else if (*(char *)&((ImVec2 *)text)->x == '\0') goto LAB_00124c1f;
        text = (char *)((long)&((ImVec2 *)text)->x + 1);
      } while ((ImVec2 *)text != (ImVec2 *)0xffffffffffffffff);
    }
    text = (char *)0xffffffffffffffff;
  }
LAB_00124c1f:
  fVar1 = (pIVar3->DC).LogLinePosY;
  (pIVar3->DC).LogLinePosY = in_XMM0_Da;
  iVar6 = pIVar4->LogStartDepth;
  iVar2 = (pIVar3->DC).TreeDepth;
  if (iVar2 < iVar6) {
    pIVar4->LogStartDepth = iVar2;
    iVar6 = iVar2;
  }
  pIVar7 = ref_pos;
  do {
    if (pIVar7 < text) {
      lVar5 = (long)text - (long)pIVar7;
      pIVar9 = pIVar7;
      do {
        if (*(char *)&pIVar9->x == '\n') goto LAB_00124c92;
        pIVar9 = (ImVec2 *)((long)&pIVar9->x + 1);
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pIVar9 = (ImVec2 *)0x0;
LAB_00124c92:
    pIVar8 = pIVar9;
    if (pIVar9 == (ImVec2 *)0x0) {
      pIVar8 = (ImVec2 *)text;
    }
    if (pIVar9 != (ImVec2 *)0x0 || pIVar8 != pIVar7) {
      if ((fVar1 + 1.0 < in_XMM0_Da) || (pIVar7 != ref_pos)) {
        ImGui::LogText("\n%*s%.*s",(ulong)(uint)((iVar2 - iVar6) * 4),"");
      }
      else {
        ImGui::LogText(" %.*s",(ulong)(uint)((int)pIVar8 - (int)pIVar7),pIVar7);
      }
    }
    pIVar7 = (ImVec2 *)((long)&pIVar8->x + 1);
    if (pIVar9 == (ImVec2 *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void LogRenderedText(const ImVec2& ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = ImGui::GetCurrentWindowRead();

    if (!text_end)
        text_end = ImGui::FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos.y > window->DC.LogLinePosY+1;
    window->DC.LogLinePosY = ref_pos.y;

    const char* text_remaining = text;
    if (g.LogStartDepth > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogStartDepth = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogStartDepth);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        const char* line_end = text_remaining;
        while (line_end < text_end)
            if (*line_end == '\n')
                break;
            else
                line_end++;
        if (line_end >= text_end)
            line_end = NULL;

        const bool is_first_line = (text == text_remaining);
        bool is_last_line = false;
        if (line_end == NULL)
        {
            is_last_line = true;
            line_end = text_end;
        }
        if (line_end != NULL && !(is_last_line && (line_end - text_remaining)==0))
        {
            const int char_count = (int)(line_end - text_remaining);
            if (log_new_line || !is_first_line)
                ImGui::LogText(IM_NEWLINE "%*s%.*s", tree_depth*4, "", char_count, text_remaining);
            else
                ImGui::LogText(" %.*s", char_count, text_remaining);
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}